

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.hpp
# Opt level: O1

int ixy::IxgbeDevice::init(EVP_PKEY_CTX *ctx)

{
  pointer pcVar1;
  EVP_PKEY_CTX *pEVar2;
  __uid_t _Var3;
  undefined8 *puVar4;
  ushort in_CX;
  ushort in_DX;
  string *in_RSI;
  pair<unsigned_char_*,_unsigned_long> pVar5;
  vector<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_> tx_queues;
  IxgbeDevice dev;
  vector<ixy::ixgbe_rx_queue,_std::allocator<ixy::ixgbe_rx_queue>_> rx_queues;
  ushort local_13c;
  ushort local_13a;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_138;
  unsigned_short *local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  vector<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_> local_118;
  EVP_PKEY_CTX *local_100;
  undefined1 local_f8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  pair<unsigned_char_*,_unsigned_long> local_d0;
  ushort local_c0;
  ushort uStack_be;
  vector<ixy::ixgbe_rx_queue,_std::allocator<ixy::ixgbe_rx_queue>_> local_b8;
  vector<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_> local_a0;
  vector<ixy::ixgbe_rx_queue,_std::allocator<ixy::ixgbe_rx_queue>_> local_88;
  vector<ixy::ixgbe_rx_queue,_std::allocator<ixy::ixgbe_rx_queue>_> local_68;
  vector<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_> local_48;
  
  local_13c = in_CX;
  local_13a = in_DX;
  _Var3 = getuid();
  if (_Var3 != 0) {
    local_f8._8_8_ = "not running as root, this will probably fail";
    warn<ixy::Pair<ixy::None,char_const*>>
              ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/ixgbe.hpp"
               ,0x2e,"init",(LogData<ixy::Pair<ixy::None,_const_char_*>_> *)local_f8);
  }
  if (0x40 < local_13a) {
    local_f8._8_8_ = "cannot configure ";
    local_f8._16_8_ = &local_13a;
    local_e0._M_allocated_capacity = 0x10d323;
    local_e0._8_8_ = &MAX_QUEUES;
    error<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::None,char_const*>,unsigned_short_const&>,char_const*>,unsigned_int_const&>>
              ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/ixgbe.hpp"
               ,0x32,"init",
               (LogData<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::None,_const_char_*>,_const_unsigned_short_&>,_const_char_*>,_const_unsigned_int_&>_>
                *)local_f8);
  }
  if (0x40 < local_13c) {
    local_f8._8_8_ = "cannot configure ";
    local_f8._16_8_ = &local_13c;
    local_e0._M_allocated_capacity = 0x10d339;
    local_e0._8_8_ = &MAX_QUEUES;
    error<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::None,char_const*>,unsigned_short_const&>,char_const*>,unsigned_int_const&>>
              ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/ixgbe.hpp"
               ,0x36,"init",
               (LogData<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::None,_const_char_*>,_const_unsigned_short_&>,_const_char_*>,_const_unsigned_int_&>_>
                *)local_f8);
  }
  local_88.super__Vector_base<ixy::ixgbe_rx_queue,_std::allocator<ixy::ixgbe_rx_queue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<ixy::ixgbe_rx_queue,_std::allocator<ixy::ixgbe_rx_queue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<ixy::ixgbe_rx_queue,_std::allocator<ixy::ixgbe_rx_queue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118.super__Vector_base<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118.super__Vector_base<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.super__Vector_base<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<ixy::ixgbe_rx_queue,_std::allocator<ixy::ixgbe_rx_queue>_>::reserve
            (&local_88,(ulong)local_13a);
  std::vector<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_>::reserve
            (&local_118,(ulong)local_13c);
  pVar5 = pci_map_resource(in_RSI);
  pcVar1 = (in_RSI->_M_dataplus)._M_p;
  local_138 = &local_128;
  local_100 = ctx;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_138,pcVar1,pcVar1 + in_RSI->_M_string_length);
  std::vector<ixy::ixgbe_rx_queue,_std::allocator<ixy::ixgbe_rx_queue>_>::vector
            (&local_68,&local_88);
  std::vector<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_>::vector
            (&local_48,&local_118);
  local_f8._8_8_ = &local_e0;
  local_f8._0_8_ = &PTR__IxgbeDevice_00112c08;
  if (local_138 == &local_128) {
    local_e0._8_8_ = local_128._8_8_;
  }
  else {
    local_f8._8_8_ = local_138;
  }
  local_e0._M_allocated_capacity._1_7_ = local_128._M_allocated_capacity._1_7_;
  local_e0._M_local_buf[0] = local_128._M_local_buf[0];
  local_f8._16_8_ = local_130;
  local_130 = (unsigned_short *)0x0;
  local_128._M_local_buf[0] = '\0';
  uStack_be = local_13c;
  local_c0 = local_13a;
  local_b8.super__Vector_base<ixy::ixgbe_rx_queue,_std::allocator<ixy::ixgbe_rx_queue>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_68.super__Vector_base<ixy::ixgbe_rx_queue,_std::allocator<ixy::ixgbe_rx_queue>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_b8.super__Vector_base<ixy::ixgbe_rx_queue,_std::allocator<ixy::ixgbe_rx_queue>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_68.super__Vector_base<ixy::ixgbe_rx_queue,_std::allocator<ixy::ixgbe_rx_queue>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_b8.super__Vector_base<ixy::ixgbe_rx_queue,_std::allocator<ixy::ixgbe_rx_queue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_68.super__Vector_base<ixy::ixgbe_rx_queue,_std::allocator<ixy::ixgbe_rx_queue>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_68.super__Vector_base<ixy::ixgbe_rx_queue,_std::allocator<ixy::ixgbe_rx_queue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<ixy::ixgbe_rx_queue,_std::allocator<ixy::ixgbe_rx_queue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<ixy::ixgbe_rx_queue,_std::allocator<ixy::ixgbe_rx_queue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a0.super__Vector_base<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_48.super__Vector_base<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_a0.super__Vector_base<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_48.super__Vector_base<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_a0.super__Vector_base<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_48.super__Vector_base<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48.super__Vector_base<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138 = &local_128;
  local_d0 = pVar5;
  std::vector<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_>::~vector(&local_48);
  std::vector<ixy::ixgbe_rx_queue,_std::allocator<ixy::ixgbe_rx_queue>_>::~vector(&local_68);
  if (local_138 != &local_128) {
    operator_delete(local_138,
                    CONCAT71(local_128._M_allocated_capacity._1_7_,local_128._M_local_buf[0]) + 1);
  }
  reset_and_init((IxgbeDevice *)local_f8);
  pEVar2 = local_100;
  puVar4 = (undefined8 *)operator_new(0x70);
  *puVar4 = &PTR__IxgbeDevice_00112c08;
  puVar4[1] = puVar4 + 3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(puVar4 + 1),local_f8._8_8_,(pointer)(local_f8._16_8_ + local_f8._8_8_));
  *(undefined4 *)(puVar4 + 7) = _local_c0;
  puVar4[5] = local_d0.first;
  puVar4[6] = local_d0.second;
  puVar4[8] = local_b8.super__Vector_base<ixy::ixgbe_rx_queue,_std::allocator<ixy::ixgbe_rx_queue>_>
              ._M_impl.super__Vector_impl_data._M_start;
  puVar4[9] = local_b8.super__Vector_base<ixy::ixgbe_rx_queue,_std::allocator<ixy::ixgbe_rx_queue>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  puVar4[10] = local_b8.
               super__Vector_base<ixy::ixgbe_rx_queue,_std::allocator<ixy::ixgbe_rx_queue>_>._M_impl
               .super__Vector_impl_data._M_end_of_storage;
  local_b8.super__Vector_base<ixy::ixgbe_rx_queue,_std::allocator<ixy::ixgbe_rx_queue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.super__Vector_base<ixy::ixgbe_rx_queue,_std::allocator<ixy::ixgbe_rx_queue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.super__Vector_base<ixy::ixgbe_rx_queue,_std::allocator<ixy::ixgbe_rx_queue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar4[0xb] = local_a0.
                super__Vector_base<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_>.
                _M_impl.super__Vector_impl_data._M_start;
  puVar4[0xc] = local_a0.
                super__Vector_base<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_>.
                _M_impl.super__Vector_impl_data._M_finish;
  puVar4[0xd] = local_a0.
                super__Vector_base<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_a0.super__Vector_base<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a0.super__Vector_base<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a0.super__Vector_base<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 **)pEVar2 = puVar4;
  local_f8._0_8_ = &PTR__IxgbeDevice_00112c08;
  std::vector<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_>::~vector(&local_a0);
  std::vector<ixy::ixgbe_rx_queue,_std::allocator<ixy::ixgbe_rx_queue>_>::~vector(&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._8_8_ != &local_e0) {
    operator_delete((void *)local_f8._8_8_,(ulong)(local_e0._M_allocated_capacity + 1));
  }
  std::vector<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_>::~vector(&local_118);
  std::vector<ixy::ixgbe_rx_queue,_std::allocator<ixy::ixgbe_rx_queue>_>::~vector(&local_88);
  return (int)pEVar2;
}

Assistant:

static auto
    init(const std::string &pci_addr, uint16_t num_rx_queues,
         uint16_t num_tx_queues) -> std::unique_ptr<IxgbeDevice> {
        if (getuid()) {
            warn("not running as root, this will probably fail");
        }

        if (num_rx_queues > MAX_QUEUES) {
            error("cannot configure " << num_rx_queues << " rx queues: limit is " << MAX_QUEUES);
        }

        if (num_tx_queues > MAX_QUEUES) {
            error("cannot configure " << num_tx_queues << " tx queues: limit is " << MAX_QUEUES);
        }

        std::vector<ixgbe_rx_queue> rx_queues;
        std::vector<ixgbe_tx_queue> tx_queues;

        rx_queues.reserve(num_rx_queues);
        tx_queues.reserve(num_tx_queues);

        auto mapped_region = pci_map_resource(pci_addr);

        auto addr = mapped_region.first;
        auto len = mapped_region.second;

        auto dev = IxgbeDevice{pci_addr, addr, len, num_rx_queues, num_tx_queues, rx_queues, tx_queues};

        dev.reset_and_init();

        return std::make_unique<IxgbeDevice>(std::move(dev));
    }